

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O0

int Precond(sunrealtype tn,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
           void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long *plVar9;
  long lVar10;
  long lVar11;
  undefined4 *in_RCX;
  int in_EDX;
  undefined8 in_RDI;
  long *in_R8;
  double dVar12;
  double dVar13;
  ulong in_XMM1_Qa;
  sunrealtype C3;
  sunrealtype Q2;
  sunrealtype Q1;
  UserData data;
  sunrealtype **j;
  sunrealtype **a;
  sunrealtype *ydata;
  int jz;
  int jx;
  sunindextype *(*pivot) [15];
  sunindextype retval;
  sunrealtype **(*Jbd) [15];
  sunrealtype **(*P) [15];
  sunrealtype hordco;
  sunrealtype verdco;
  sunrealtype delz;
  sunrealtype q4coef;
  sunrealtype zup;
  sunrealtype zdn;
  sunrealtype diag;
  sunrealtype czup;
  sunrealtype czdn;
  sunrealtype c2;
  sunrealtype c1;
  int local_c0;
  int local_bc;
  
  lVar11 = N_VGetArrayPointer(in_RDI);
  dVar1 = *(double *)*in_R8;
  dVar2 = *(double *)(*in_R8 + 8);
  dVar3 = *(double *)(*in_R8 + 0x10);
  if (in_EDX == 0) {
    dVar4 = (double)in_R8[0x2a4];
    dVar5 = (double)in_R8[0x2a7];
    dVar6 = (double)in_R8[0x2aa];
    dVar7 = (double)in_R8[0x2a8];
    for (local_c0 = 0; local_c0 < 0xf; local_c0 = local_c0 + 1) {
      dVar12 = ((double)local_c0 - 0.5) * dVar5 + 30.0;
      dVar13 = exp(dVar12 * 0.2);
      dVar12 = exp((dVar12 + dVar5) * 0.2);
      dVar12 = -(dVar7 + dVar7 + dVar6 * dVar13 + dVar6 * dVar12);
      for (local_bc = 0; local_bc < 0xf; local_bc = local_bc + 1) {
        dVar13 = *(double *)(lVar11 + (long)(local_bc * 2 + local_c0 * 0x1e) * 8);
        dVar8 = *(double *)(lVar11 + (long)(local_bc * 2 + 1 + local_c0 * 0x1e) * 8);
        plVar9 = (long *)in_R8[(long)local_bc * 0xf + (long)local_c0 + 0xe2];
        lVar10 = in_R8[(long)local_bc * 0xf + (long)local_c0 + 1];
        *(double *)*plVar9 = -dVar1 * dVar3 + -(dVar2 * dVar8) + dVar12;
        *(double *)plVar9[1] = -dVar2 * dVar13 + dVar4;
        *(double *)(*plVar9 + 8) = dVar1 * dVar3 + -(dVar2 * dVar8);
        *(double *)(plVar9[1] + 8) = -dVar2 * dVar13 + -dVar4 + dVar12;
        SUNDlsMat_denseCopy(plVar9,lVar10,2);
      }
    }
    *in_RCX = 1;
  }
  else {
    for (local_c0 = 0; local_c0 < 0xf; local_c0 = local_c0 + 1) {
      for (local_bc = 0; local_bc < 0xf; local_bc = local_bc + 1) {
        SUNDlsMat_denseCopy(in_R8[(long)local_bc * 0xf + (long)local_c0 + 0xe2],
                            in_R8[(long)local_bc * 0xf + (long)local_c0 + 1],2);
      }
    }
    *in_RCX = 0;
  }
  for (local_c0 = 0; local_c0 < 0xf; local_c0 = local_c0 + 1) {
    for (local_bc = 0; local_bc < 0xf; local_bc = local_bc + 1) {
      SUNDlsMat_denseScale
                (in_XMM1_Qa ^ 0x8000000000000000,in_R8[(long)local_bc * 0xf + (long)local_c0 + 1],2)
      ;
    }
  }
  local_bc = 0;
  do {
    if (0xe < local_bc) {
      return 0;
    }
    for (local_c0 = 0; local_c0 < 0xf; local_c0 = local_c0 + 1) {
      SUNDlsMat_denseAddIdentity(in_R8[(long)local_bc * 0xf + (long)local_c0 + 1],2);
      lVar11 = SUNDlsMat_denseGETRF
                         (in_R8[(long)local_bc * 0xf + (long)local_c0 + 1],2,2,
                          in_R8[(long)local_bc * 0xf + (long)local_c0 + 0x1c3]);
      if (lVar11 != 0) {
        return 1;
      }
    }
    local_bc = local_bc + 1;
  } while( true );
}

Assistant:

static int Precond(sunrealtype tn, N_Vector y, N_Vector fy, sunbooleantype jok,
                   sunbooleantype* jcurPtr, sunrealtype gamma, void* user_data)
{
  sunrealtype c1, c2, czdn, czup, diag, zdn, zup, q4coef, delz, verdco, hordco;
  sunrealtype**(*P)[MZ], **(*Jbd)[MZ];
  sunindextype retval;
  sunindextype*(*pivot)[MZ];
  int jx, jz;
  sunrealtype *ydata, **a, **j;
  UserData data;
  sunrealtype Q1, Q2, C3;

  /* Make local copies of pointers in user_data, and of pointer to y's data */
  data  = (UserData)user_data;
  P     = data->P;
  Jbd   = data->Jbd;
  pivot = data->pivot;
  ydata = N_VGetArrayPointer(y);

  /* Load problem coefficients and parameters */
  Q1 = data->p[0];
  Q2 = data->p[1];
  C3 = data->p[2];

  if (jok)
  {
    /* jok = SUNTRUE: Copy Jbd to P */

    for (jz = 0; jz < MZ; jz++)
    {
      for (jx = 0; jx < MX; jx++)
      {
        SUNDlsMat_denseCopy(Jbd[jx][jz], P[jx][jz], NUM_SPECIES, NUM_SPECIES);
      }
    }

    *jcurPtr = SUNFALSE;
  }

  else
  {
    /* jok = SUNFALSE: Generate Jbd from scratch and copy to P */

    /* Make local copies of problem variables, for efficiency. */

    q4coef = data->q4;
    delz   = data->dz;
    verdco = data->vdco;
    hordco = data->hdco;

    /* Compute 2x2 diagonal Jacobian blocks (using q4 values
     computed on the last f call).  Load into P. */

    for (jz = 0; jz < MZ; jz++)
    {
      zdn  = ZMIN + (jz - SUN_RCONST(0.5)) * delz;
      zup  = zdn + delz;
      czdn = verdco * exp(SUN_RCONST(0.2) * zdn);
      czup = verdco * exp(SUN_RCONST(0.2) * zup);
      diag = -(czdn + czup + SUN_RCONST(2.0) * hordco);
      for (jx = 0; jx < MX; jx++)
      {
        c1            = IJKth(ydata, 1, jx, jz);
        c2            = IJKth(ydata, 2, jx, jz);
        j             = Jbd[jx][jz];
        a             = P[jx][jz];
        IJth(j, 1, 1) = (-Q1 * C3 - Q2 * c2) + diag;
        IJth(j, 1, 2) = -Q2 * c1 + q4coef;
        IJth(j, 2, 1) = Q1 * C3 - Q2 * c2;
        IJth(j, 2, 2) = (-Q2 * c1 - q4coef) + diag;
        SUNDlsMat_denseCopy(j, a, NUM_SPECIES, NUM_SPECIES);
      }
    }

    *jcurPtr = SUNTRUE;
  }

  /* Scale by -gamma */

  for (jz = 0; jz < MZ; jz++)
  {
    for (jx = 0; jx < MX; jx++)
    {
      SUNDlsMat_denseScale(-gamma, P[jx][jz], NUM_SPECIES, NUM_SPECIES);
    }
  }

  /* Add identity matrix and do LU decompositions on blocks in place. */

  for (jx = 0; jx < MX; jx++)
  {
    for (jz = 0; jz < MZ; jz++)
    {
      SUNDlsMat_denseAddIdentity(P[jx][jz], NUM_SPECIES);
      retval = SUNDlsMat_denseGETRF(P[jx][jz], NUM_SPECIES, NUM_SPECIES,
                                    pivot[jx][jz]);
      if (retval != 0) { return (1); }
    }
  }

  return (0);
}